

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

void __thiscall BuildStatus::BuildEdgeStarted(BuildStatus *this,Edge *edge)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int64_t iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pair<const_Edge_*,_int> local_28;
  
  p_Var1 = &(this->running_edges_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(Edge **)(p_Var5 + 1) < edge]) {
    if (*(Edge **)(p_Var5 + 1) >= edge) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, edge < *(Edge **)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    iVar3 = GetTimeMillis();
    local_28.second = (int)iVar3 - (int)this->start_time_millis_;
    local_28.first = edge;
    std::
    _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
    ::_M_emplace_unique<std::pair<Edge_const*,int>>
              ((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                *)&this->running_edges_,&local_28);
    this->started_edges_ = this->started_edges_ + 1;
    bVar2 = Edge::use_console(edge);
    if ((bVar2) || ((this->printer_).smart_terminal_ == true)) {
      PrintStatus(this,edge,kEdgeStarted);
    }
    bVar2 = Edge::use_console(edge);
    if (bVar2) {
      LinePrinter::SetConsoleLocked(&this->printer_,true);
    }
    return;
  }
  __assert_fail("running_edges_.find(edge) == running_edges_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                ,99,"void BuildStatus::BuildEdgeStarted(const Edge *)");
}

Assistant:

void BuildStatus::BuildEdgeStarted(const Edge* edge) {
  assert(running_edges_.find(edge) == running_edges_.end());
  int start_time = (int)(GetTimeMillis() - start_time_millis_);
  running_edges_.insert(make_pair(edge, start_time));
  ++started_edges_;

  if (edge->use_console() || printer_.is_smart_terminal())
    PrintStatus(edge, kEdgeStarted);

  if (edge->use_console())
    printer_.SetConsoleLocked(true);
}